

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_state.cc
# Opt level: O2

void __thiscall StateVar::GenSetFunction(StateVar *this,Output *out_h,Env *env)

{
  char *pcVar1;
  string local_68;
  string local_48;
  
  set_function_abi_cxx11_(&local_48,this->id_);
  Type::DataTypeConstRefStr_abi_cxx11_(&local_68,this->type_);
  pcVar1 = Env::LValue(env,this->id_);
  Output::println(out_h,"void %s(%s x) \t{ %s = x; }",local_48._M_dataplus._M_p,
                  local_68._M_dataplus._M_p,pcVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void StateVar::GenSetFunction(Output* out_h, Env* env)
	{
	out_h->println("void %s(%s x) 	{ %s = x; }", set_function(id_).c_str(),
	               type_->DataTypeConstRefStr().c_str(), env->LValue(id_));
	}